

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.h
# Opt level: O1

void __thiscall icu_63::RuleBasedBreakIterator::BreakCache::next(BreakCache *this)

{
  int32_t iVar1;
  RuleBasedBreakIterator *pRVar2;
  byte bVar3;
  uint uVar4;
  
  if (this->fBufIdx != this->fEndBufIdx) {
    uVar4 = this->fBufIdx + 1U & 0x7f;
    this->fBufIdx = uVar4;
    iVar1 = this->fBoundaries[uVar4];
    pRVar2 = this->fBI;
    pRVar2->fPosition = iVar1;
    this->fTextIdx = iVar1;
    pRVar2->fRuleStatusIndex = (uint)this->fStatuses[uVar4];
    return;
  }
  bVar3 = populateFollowing(this);
  pRVar2 = this->fBI;
  pRVar2->fDone = bVar3 ^ 1;
  pRVar2->fPosition = this->fTextIdx;
  pRVar2->fRuleStatusIndex = (uint)this->fStatuses[this->fBufIdx];
  return;
}

Assistant:

void        next() {    if (fBufIdx == fEndBufIdx) {
                                nextOL();
                            } else {
                                fBufIdx = modChunkSize(fBufIdx + 1);
                                fTextIdx = fBI->fPosition = fBoundaries[fBufIdx];
                                fBI->fRuleStatusIndex = fStatuses[fBufIdx];
                            }
                }